

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O1

void __thiscall cmFLTKWrapUICommand::FinalPass(cmFLTKWrapUICommand *this)

{
  cmTarget *pcVar1;
  string msg;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = cmMakefile::FindLocalNonAliasTarget((this->super_cmCommand).Makefile,&this->Target);
  if (pcVar1 == (cmTarget *)0x0) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,"FLTK_WRAP_UI was called with a target that was never created: ",
               "");
    std::__cxx11::string::_M_append((char *)local_38,(ulong)(this->Target)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)local_38);
    cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::append((char *)local_38);
    std::__cxx11::string::append((char *)local_38);
    cmSystemTools::Message((char *)local_38[0],"Warning");
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void cmFLTKWrapUICommand::FinalPass()
{
  // people should add the srcs to the target themselves, but the old command
  // didn't support that, so check and see if they added the files in and if
  // they didn;t then print a warning and add then anyhow
  cmTarget* target = this->Makefile->FindLocalNonAliasTarget(this->Target);
  if (!target) {
    std::string msg =
      "FLTK_WRAP_UI was called with a target that was never created: ";
    msg += this->Target;
    msg += ".  The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    msg += ".  This FLTK_WRAP_UI call will be ignored.";
    cmSystemTools::Message(msg.c_str(), "Warning");
    return;
  }
}